

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

bool __thiscall Js::ParseableFunctionInfo::IsFunctionParsed(ParseableFunctionInfo *this)

{
  BOOL BVar1;
  bool local_11;
  ParseableFunctionInfo *this_local;
  
  BVar1 = FunctionProxy::IsDeferredParseFunction(&this->super_FunctionProxy);
  local_11 = true;
  if (BVar1 != 0) {
    local_11 = (bool)((byte)(*(ushort *)&(this->super_FunctionProxy).field_0x45 >> 1) & 1);
  }
  return local_11;
}

Assistant:

bool IsFunctionParsed()
        {
            return !IsDeferredParseFunction() || m_hasBeenParsed;
        }